

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nalUnits.cpp
# Opt level: O1

int __thiscall PPSUnit::deserialize(PPSUnit *this)

{
  BitStreamReader *this_00;
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  int iVar6;
  uint num;
  
  pbVar1 = (this->super_NALUnit).m_nalBuffer;
  uVar3 = (this->super_NALUnit).m_nalBufferLen;
  if ((ulong)uVar3 == 0) {
    iVar6 = -10;
  }
  else {
    (this->super_NALUnit).nal_ref_idc = *pbVar1 >> 5 & 3;
    (this->super_NALUnit).nal_unit_type = *pbVar1 & (nuDummy|nuSliceNonIDR);
    iVar6 = 0;
  }
  if ((uVar3 != 0) && (iVar6 = -10, uVar3 != 1)) {
    this_00 = &(this->super_NALUnit).bitReader;
    BitStream::setBuffer(&this_00->super_BitStream,pbVar1 + 1,pbVar1 + uVar3);
    (this->super_NALUnit).bitReader.m_bitLeft = 0;
    uVar3 = BitStreamReader::getCurVal
                      (this_00,(this->super_NALUnit).bitReader.super_BitStream.m_buffer);
    (this->super_NALUnit).bitReader.m_curVal = uVar3;
    (this->super_NALUnit).bitReader.m_bitLeft = 0x20;
    uVar3 = 0xffffffff;
    do {
      bVar2 = BitStreamReader::getBit(this_00);
      uVar3 = uVar3 + 1;
    } while (!bVar2);
    if (0x20 < uVar3) {
LAB_001c2f1e:
      puVar5 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar5 = &PTR__exception_0023f8a8;
      __cxa_throw(puVar5,&BitStreamException::typeinfo,std::exception::~exception);
    }
    uVar4 = BitStreamReader::getBits(this_00,uVar3);
    num = 0xffffffff;
    uVar4 = uVar4 + ~(-1 << ((byte)uVar3 & 0x1f));
    this->pic_parameter_set_id = uVar4;
    iVar6 = 1;
    if (uVar4 < 0x100) {
      do {
        bVar2 = BitStreamReader::getBit(this_00);
        num = num + 1;
      } while (!bVar2);
      if (0x20 < num) goto LAB_001c2f1e;
      uVar3 = BitStreamReader::getBits(this_00,num);
      uVar3 = uVar3 + ~(-1 << ((byte)num & 0x1f));
      this->seq_parameter_set_id = uVar3;
      if (uVar3 < 0x20) {
        bVar2 = BitStreamReader::getBit(this_00);
        this->entropy_coding_mode_flag = (uint)bVar2;
        bVar2 = BitStreamReader::getBit(this_00);
        this->pic_order_present_flag = (uint)bVar2;
        this->m_ready = true;
        iVar6 = 0;
      }
    }
  }
  return iVar6;
}

Assistant:

int PPSUnit::deserialize()
{
    uint8_t* nalEnd = m_nalBuffer + m_nalBufferLen;
    const int rez = NALUnit::deserialize(m_nalBuffer, nalEnd);
    if (rez != 0)
        return rez;
    if (nalEnd - m_nalBuffer < 2)
        return NOT_ENOUGH_BUFFER;
    try
    {
        bitReader.setBuffer(m_nalBuffer + 1, nalEnd);
        pic_parameter_set_id = extractUEGolombCode();
        if (pic_parameter_set_id >= 256)
            return 1;
        seq_parameter_set_id = extractUEGolombCode();
        if (seq_parameter_set_id >= 32)
            return 1;
        entropy_coding_mode_flag = bitReader.getBit();
        pic_order_present_flag = bitReader.getBit();

        m_ready = true;
        return 0;
    }
    catch (BitStreamException& e)
    {
        (void)e;
        return NOT_ENOUGH_BUFFER;
    }
}